

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

SSTableDataEntry * __thiscall
SSTable::getEntry(SSTableDataEntry *__return_storage_ptr__,SSTable *this,longlong offset)

{
  ifstream in;
  istream aiStack_228 [520];
  
  std::ifstream::ifstream(aiStack_228,(this->file)._M_pathname._M_dataplus._M_p,_S_in|_S_bin);
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->value)._M_string_length = 0;
  (__return_storage_ptr__->value).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = 0;
  __return_storage_ptr__->key = 0;
  __return_storage_ptr__->value_length = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->timestamp = 0;
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
  std::istream::seekg(aiStack_228,offset,0);
  operator>>(aiStack_228,__return_storage_ptr__);
  std::ifstream::~ifstream(aiStack_228);
  return __return_storage_ptr__;
}

Assistant:

SSTableDataEntry SSTable::getEntry(long long offset) {
    // Just offer basic reading by offset,
    // search by key in index leave in DiskTable.
    auto in = create_binary_ifstream(file);
    auto temp = SSTableDataEntry{};
    in.seekg(offset);
    in >> temp;
    return temp;
}